

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O1

plain_range_sorted<CCountryFlags::CCountryFlag>
partition_binary<plain_range_sorted<CCountryFlags::CCountryFlag>,CCountryFlags::CCountryFlag>
          (plain_range_sorted<CCountryFlags::CCountryFlag> range,CCountryFlag value)

{
  uint uVar1;
  int iVar2;
  CCountryFlag *pCVar3;
  uint uVar4;
  CCountryFlag *pCVar5;
  plain_range_sorted<CCountryFlags::CCountryFlag> pVar6;
  
  pCVar5 = range.super_plain_range<CCountryFlags::CCountryFlag>.end;
  pCVar3 = range.super_plain_range<CCountryFlags::CCountryFlag>.begin;
  if (pCVar3 < pCVar5) {
    dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/base/tl/range.h"
                   ,0x97,1,"empty");
    iVar2 = str_comp(pCVar5[-1].m_aCountryCodeString,value.m_aCountryCodeString);
    if (iVar2 < 0) {
      pCVar3 = (CCountryFlag *)0x0;
      pCVar5 = (CCountryFlag *)0x0;
    }
    else {
      iVar2 = (int)((ulong)((long)pCVar5 - (long)pCVar3) >> 2);
      while (uVar1 = iVar2 * -0x33333333, 1 < uVar1) {
        uVar4 = uVar1 - 1 >> 1;
        dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/base/tl/range.h"
                       ,0x98,(uint)(uVar4 < uVar1),"out of range");
        iVar2 = str_comp(pCVar3[uVar4].m_aCountryCodeString,value.m_aCountryCodeString);
        pCVar5 = pCVar3 + (uVar4 + 1);
        if (iVar2 < 0) {
          pCVar3 = pCVar5;
        }
        pCVar5 = pCVar5 + (iVar2 >> 0x1f & uVar1 - 1);
        iVar2 = (int)((ulong)((long)pCVar5 - (long)pCVar3) >> 2);
      }
    }
  }
  pVar6.super_plain_range<CCountryFlags::CCountryFlag>.end = pCVar5;
  pVar6.super_plain_range<CCountryFlags::CCountryFlag>.begin = pCVar3;
  return (plain_range_sorted<CCountryFlags::CCountryFlag>)
         pVar6.super_plain_range<CCountryFlags::CCountryFlag>;
}

Assistant:

R partition_binary(R range, T value)
{
	concept_empty::check(range);
	concept_index::check(range);
	concept_size::check(range);
	concept_slice::check(range);
	concept_sorted::check(range);

	if(range.empty())
		return range;
	if(range.back() < value)
		return R();

	while(range.size() > 1)
	{
		unsigned pivot = (range.size()-1)/2;
		if(range.index(pivot) < value)
			range = range.slice(pivot+1, range.size()-1);
		else
			range = range.slice(0, pivot+1);
	}
	return range;
}